

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_164db4ee comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  pdqsort_detail *ppVar9;
  HighsSymmetryDetection *pHVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  pdqsort_detail *ppVar14;
  undefined4 in_register_0000008c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  int *piVar17;
  long lVar18;
  pdqsort_detail *ppVar19;
  ulong uVar20;
  int *piVar21;
  int *piVar22;
  anon_class_16_2_164db4ee comp_00;
  anon_class_16_2_164db4ee comp_01;
  anon_class_16_2_164db4ee comp_02;
  anon_class_16_2_164db4ee comp_03;
  anon_class_16_2_164db4ee comp_04;
  anon_class_16_2_164db4ee comp_05;
  anon_class_16_2_164db4ee comp_06;
  anon_class_16_2_164db4ee comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HighsSymmetry_cpp:1432:46)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HighsSymmetry_cpp:1432:46)>
  __comp_00;
  _DistanceType __len;
  long lVar23;
  uint local_6c;
  int local_5c;
  HighsSymmetryDetection *pHVar15;
  
  pHVar15 = (HighsSymmetryDetection *)CONCAT44(in_register_0000008c,bad_allowed);
  comp_00.componentData = (HighsSymmetryDetection *)comp.componentData;
  local_5c = (int)comp.this;
  uVar11 = (long)begin._M_current - (long)this >> 2;
  if (0x17 < (long)uVar11) {
    b._M_current = begin._M_current + -1;
    pHVar10 = (HighsSymmetryDetection *)((long)begin._M_current - (long)this);
    local_6c = bad_allowed;
LAB_002febf1:
    uVar20 = uVar11 >> 1;
    _Var16._M_current = (int *)((long)this + uVar20 * 4);
    if (uVar11 < 0x81) {
      comp_07.this = pHVar15;
      comp_07.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)_Var16._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,b,end,
                 comp_07);
    }
    else {
      comp_03.this = pHVar15;
      comp_03.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                (this,_Var16,b,end,comp_03);
      comp_04.this = pHVar15;
      comp_04.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + 4),(int *)((long)this + (uVar20 - 1) * 4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -2),end,comp_04);
      piVar17 = (int *)((long)this + uVar20 * 4);
      comp_05.this = pHVar15;
      comp_05.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + 8),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar17 + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -3),end,comp_05);
      comp_06.this = pHVar15;
      comp_06.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + (uVar20 - 1) * 4),_Var16,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar17 + 1),
                 end,comp_06);
      iVar1 = *(int *)this;
      *(int *)this = *piVar17;
      *piVar17 = iVar1;
    }
    if ((local_6c & 1) == 0) {
      iVar1 = *(int *)this;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)((long)this + -4)]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar1 == 1) || (iVar2 != 1)) {
        if ((HVar8 <= HVar7) || (iVar1 == 1 && iVar2 != 1)) {
          iVar1 = *(int *)this;
          lVar23 = 0;
          do {
            iVar2 = *(b._M_current + lVar23);
            HVar7 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
            if ((iVar2 == 1) || (iVar3 != 1)) {
              if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) goto LAB_002fef06;
            }
            lVar23 = lVar23 + -4;
          } while( true );
        }
      }
    }
    iVar1 = *(int *)this;
    lVar23 = 0;
    _Var16._M_current = (int *)this;
    do {
      piVar17 = _Var16._M_current + 1;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar17]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar2 == 1) || (iVar3 != 1)) {
        if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) goto LAB_002feda5;
      }
      lVar23 = lVar23 + -4;
      _Var16._M_current = piVar17;
    } while( true );
  }
  if ((char)bad_allowed == '\0') goto LAB_002ff454;
LAB_002fea77:
  if ((this != (pdqsort_detail *)begin._M_current) &&
     (this + 4 != (pdqsort_detail *)begin._M_current)) {
    lVar23 = 0;
    ppVar19 = this + 4;
    ppVar14 = this;
    do {
      ppVar9 = ppVar19;
      iVar1 = *(int *)ppVar14;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)(ppVar14 + 4)]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar1 == 1) || (iVar2 != 1)) {
        if ((HVar7 < HVar8) && (iVar1 != 1 || iVar2 == 1)) goto LAB_002feb0a;
      }
      else {
LAB_002feb0a:
        iVar1 = *(int *)(ppVar14 + 4);
        *(undefined4 *)(ppVar14 + 4) = *(undefined4 *)ppVar14;
        ppVar19 = this;
        if (ppVar9 + -4 != this) {
          lVar18 = lVar23;
          do {
            iVar2 = *(int *)(this + lVar18 + -4);
            HVar7 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar8 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
            if ((iVar2 == 1) || (iVar3 != 1)) {
              if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) {
                ppVar19 = this + lVar18;
                break;
              }
            }
            *(undefined4 *)(this + lVar18) = *(undefined4 *)(this + lVar18 + -4);
            lVar18 = lVar18 + -4;
          } while (lVar18 != 0);
        }
        *(int *)ppVar19 = iVar1;
      }
      lVar23 = lVar23 + 4;
      ppVar19 = ppVar9 + 4;
      ppVar14 = ppVar9;
    } while (ppVar9 + 4 != (pdqsort_detail *)begin._M_current);
  }
  return;
LAB_002fef06:
  piVar17 = b._M_current + lVar23;
  piVar21 = (int *)((long)this + 4);
  if (lVar23 == 0) {
    do {
      piVar13 = piVar21 + -1;
      if (piVar17 <= piVar21 + -1) break;
      iVar2 = *piVar21;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      piVar13 = piVar21;
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      piVar21 = piVar21 + 1;
    } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  }
  else {
    do {
      piVar13 = piVar21;
      iVar2 = *piVar13;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      piVar21 = piVar13 + 1;
    } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  }
LAB_002ff414:
  if (piVar13 < piVar17) {
    iVar2 = *piVar13;
    *piVar13 = *piVar17;
    *piVar17 = iVar2;
LAB_002ff344:
    do {
      piVar17 = piVar17 + -1;
      iVar2 = *piVar17;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if (iVar2 != 1) {
        if (iVar3 == 1) goto LAB_002ff344;
      }
      if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) goto LAB_002ff3a4;
    } while( true );
  }
  *(int *)this = *piVar17;
  *piVar17 = iVar1;
  this = (pdqsort_detail *)(piVar17 + 1);
  comp_00.this = (HighsSymmetryDetection *)((long)begin._M_current - (long)this);
  uVar11 = (long)comp_00.this >> 2;
  goto LAB_002ff304;
LAB_002ff3a4:
  piVar21 = piVar13 + 1;
  do {
    piVar13 = piVar21;
    iVar2 = *piVar13;
    HVar7 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar1]);
    HVar8 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar2]);
    iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
    iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
    if ((iVar2 != 1) && (iVar3 == 1)) break;
    piVar21 = piVar13 + 1;
  } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  goto LAB_002ff414;
LAB_002feda5:
  _Var5._M_current = b._M_current;
  if (lVar23 == 0) {
    do {
      piVar13 = _Var5._M_current;
      piVar21 = piVar13 + 1;
      if (piVar13 + 1 <= piVar17) break;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar13]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      piVar21 = piVar13;
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      _Var5._M_current = piVar13 + -1;
    } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  }
  else {
    do {
      piVar21 = _Var5._M_current;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar21]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      _Var5._M_current = piVar21 + -1;
    } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  }
  piVar13 = piVar17;
  piVar22 = piVar21;
  if (piVar17 < piVar21) {
LAB_002ff027:
    iVar2 = *piVar13;
    *piVar13 = *piVar22;
    *piVar22 = iVar2;
LAB_002ff035:
    do {
      _Var16._M_current = piVar13;
      piVar13 = _Var16._M_current + 1;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar13]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if (iVar2 != 1) {
        if (iVar3 == 1) goto LAB_002ff035;
      }
      if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) goto LAB_002ff092;
    } while( true );
  }
LAB_002ff10d:
  *(int *)this = *_Var16._M_current;
  *_Var16._M_current = iVar1;
  uVar20 = (long)_Var16._M_current - (long)this >> 2;
  ppVar19 = (pdqsort_detail *)(_Var16._M_current + 1);
  comp_00.this = (HighsSymmetryDetection *)((long)begin._M_current - (long)ppVar19);
  uVar12 = (long)comp_00.this >> 2;
  if (((long)uVar20 < (long)(uVar11 >> 3)) || ((long)uVar12 < (long)(uVar11 >> 3))) {
    local_5c = local_5c + -1;
    if (local_5c == 0) {
      uVar20 = uVar11 - 2 >> 1;
      do {
        __comp._M_comp.this = comp_00.componentData;
        __comp._M_comp.componentData = (ComponentData *)end._M_current;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,uVar20,
                   uVar11,*(int *)((long)this + uVar20 * 4),__comp);
        bVar6 = uVar20 != 0;
        uVar20 = uVar20 - 1;
      } while (bVar6);
      if ((long)pHVar10 < 5) {
        return;
      }
      lVar23 = (long)begin._M_current - (long)this;
      do {
        begin._M_current = begin._M_current + -1;
        iVar1 = *begin._M_current;
        *begin._M_current = *(int *)this;
        lVar23 = lVar23 + -4;
        __comp_00._M_comp.this = comp_00.componentData;
        __comp_00._M_comp.componentData = (ComponentData *)end._M_current;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,0,
                   lVar23 >> 2,iVar1,__comp_00);
      } while (4 < lVar23);
      return;
    }
    if (0x17 < (long)uVar20) {
      uVar11 = uVar20 & 0xfffffffffffffffc;
      iVar1 = *(int *)this;
      *(int *)this = *(int *)((long)this + uVar11);
      *(int *)((long)this + uVar11) = iVar1;
      iVar1 = _Var16._M_current[-1];
      _Var16._M_current[-1] = *(_Var16._M_current - uVar11);
      *(_Var16._M_current - uVar11) = iVar1;
      if (0x80 < uVar20) {
        uVar20 = uVar20 >> 2;
        iVar1 = *(int *)((long)this + 4);
        *(int *)((long)this + 4) = *(int *)((long)this + (uVar20 + 1) * 4);
        *(int *)((long)this + (uVar20 + 1) * 4) = iVar1;
        iVar1 = *(int *)((long)this + 8);
        *(int *)((long)this + 8) = *(int *)((long)this + (uVar20 + 2) * 4);
        *(int *)((long)this + (uVar20 + 2) * 4) = iVar1;
        iVar1 = _Var16._M_current[-2];
        _Var16._M_current[-2] = _Var16._M_current[~uVar20];
        _Var16._M_current[~uVar20] = iVar1;
        iVar1 = _Var16._M_current[-3];
        _Var16._M_current[-3] = _Var16._M_current[-2 - uVar20];
        _Var16._M_current[-2 - uVar20] = iVar1;
      }
    }
    if (0x17 < (long)uVar12) {
      iVar1 = _Var16._M_current[1];
      uVar11 = uVar12 & 0xfffffffffffffffc;
      _Var16._M_current[1] = *(uVar11 + 4 + _Var16._M_current);
      *(uVar11 + 4 + _Var16._M_current) = iVar1;
      iVar1 = begin._M_current[-1];
      begin._M_current[-1] = *(begin._M_current - uVar11);
      *(begin._M_current - uVar11) = iVar1;
      if (0x80 < uVar12) {
        uVar11 = uVar12 >> 2;
        iVar1 = _Var16._M_current[2];
        _Var16._M_current[2] = _Var16._M_current[uVar11 + 2];
        _Var16._M_current[uVar11 + 2] = iVar1;
        iVar1 = _Var16._M_current[3];
        _Var16._M_current[3] = _Var16._M_current[uVar11 + 3];
        _Var16._M_current[uVar11 + 3] = iVar1;
        iVar1 = begin._M_current[-2];
        begin._M_current[-2] = begin._M_current[~uVar11];
        begin._M_current[~uVar11] = iVar1;
        iVar1 = begin._M_current[-3];
        begin._M_current[-3] = begin._M_current[-2 - uVar11];
        begin._M_current[-2 - uVar11] = iVar1;
      }
    }
  }
  else if ((piVar21 <= piVar17) &&
          ((pHVar15 = comp_00.this,
           bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                             (this,_Var16,end,comp_00), bVar6 &&
           (comp_01.this = pHVar15, comp_01.componentData = (ComponentData *)comp_00.componentData,
           bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                             (ppVar19,begin,end,comp_01), bVar6)))) {
    return;
  }
  pHVar15 = (HighsSymmetryDetection *)(ulong)(local_6c & 1);
  comp_02.this._0_4_ = local_5c;
  comp_02.componentData = (ComponentData *)comp_00.componentData;
  comp_02.this._4_4_ = 0;
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
            (this,_Var16,end,comp_02,local_6c & 1,SUB81(this,0));
  local_6c = 0;
  uVar11 = uVar12;
  this = ppVar19;
LAB_002ff304:
  pHVar10 = comp_00.this;
  if ((long)uVar11 < 0x18) goto LAB_002ff44a;
  goto LAB_002febf1;
LAB_002ff092:
  piVar4 = piVar22 + -1;
  do {
    piVar22 = piVar4;
    HVar7 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[*piVar22]);
    HVar8 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar1]);
    iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
    iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
    if ((iVar2 != 1) && (iVar3 == 1)) break;
    piVar4 = piVar22 + -1;
  } while ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1));
  if (piVar22 <= piVar13) goto LAB_002ff10d;
  goto LAB_002ff027;
LAB_002ff44a:
  if ((local_6c & 1) == 0) {
LAB_002ff454:
    if (this == (pdqsort_detail *)begin._M_current) {
      return;
    }
LAB_002ff55d:
    do {
      ppVar19 = this;
      this = ppVar19 + 4;
      if (this == (pdqsort_detail *)begin._M_current) {
        return;
      }
      iVar1 = *(int *)ppVar19;
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)(ppVar19 + 4)]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      if ((iVar1 != 1) && (iVar2 == 1)) break;
    } while ((HVar8 <= HVar7) || (iVar1 == 1 && iVar2 != 1));
    iVar1 = *(int *)this;
LAB_002ff4e0:
    do {
      ppVar14 = ppVar19;
      *(undefined4 *)(ppVar14 + 4) = *(undefined4 *)ppVar14;
      iVar2 = *(int *)(ppVar14 + -4);
      HVar7 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar7 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      ppVar19 = ppVar14 + -4;
      if (iVar2 != 1) {
        if (iVar3 == 1) goto LAB_002ff4e0;
      }
      if ((HVar8 <= HVar7) || (iVar2 == 1 && iVar3 != 1)) goto LAB_002ff552;
    } while( true );
  }
  goto LAB_002fea77;
LAB_002ff552:
  *(int *)ppVar14 = iVar1;
  goto LAB_002ff55d;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }